

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

Uint64 __thiscall
Diligent::CommandQueueVkImpl::Submit(CommandQueueVkImpl *this,VkSubmitInfo *InSubmitInfo)

{
  atomic<unsigned_long> *paVar1;
  Uint64 Value;
  SoftwareQueueIndex CommandQueueId;
  pointer ppVVar2;
  VkResult VVar3;
  VkSubmitInfo *pVVar4;
  uint32_t s;
  ulong uVar5;
  long lVar6;
  FenceVkImpl *this_00;
  SyncPointVkPtr NewSyncPoint;
  string msg_1;
  __shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2> local_88;
  string msg;
  
  std::mutex::lock(&this->m_QueueMutex);
  LOCK();
  paVar1 = &this->m_NextFenceValue;
  Value = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  CreateSyncPoint((CommandQueueVkImpl *)&NewSyncPoint,(Uint64)this);
  ppVVar2 = (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar2) {
    (this->m_TempSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar2;
  }
  SyncPointVk::GetSemaphores
            (NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&this->m_TempSignalSemaphores);
  pVVar4 = InSubmitInfo;
  do {
    pVVar4 = (VkSubmitInfo *)pVVar4->pNext;
    if (pVVar4 == (VkSubmitInfo *)0x0) goto LAB_001b0e83;
  } while (pVVar4->sType != VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO);
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FormatString<char[60]>
              (&msg,(char (*) [60])"Can not append semaphores when timeline semaphores are used");
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(VkStructureType)msg._M_dataplus._M_p),
               "Submit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)&msg);
  }
LAB_001b0e83:
  lVar6 = 0;
  for (uVar5 = 0; uVar5 < InSubmitInfo->signalSemaphoreCount; uVar5 = uVar5 + 1) {
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
              (&this->m_TempSignalSemaphores,
               (value_type *)((long)InSubmitInfo->pSignalSemaphores + lVar6));
    lVar6 = lVar6 + 8;
  }
  msg._M_dataplus._M_p._0_4_ = InSubmitInfo->sType;
  msg._M_dataplus._M_p._4_4_ = *(undefined4 *)&InSubmitInfo->field_0x4;
  msg._M_string_length._0_4_ = *(undefined4 *)&InSubmitInfo->pNext;
  msg._M_string_length._4_4_ = *(undefined4 *)((long)&InSubmitInfo->pNext + 4);
  msg.field_2._M_allocated_capacity._0_4_ = InSubmitInfo->waitSemaphoreCount;
  msg.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)&InSubmitInfo->field_0x14;
  msg.field_2._8_4_ = *(undefined4 *)&InSubmitInfo->pWaitSemaphores;
  msg.field_2._12_4_ = *(undefined4 *)((long)&InSubmitInfo->pWaitSemaphores + 4);
  VVar3 = (*vkQueueSubmit)(this->m_VkQueue,
                           SUB14((InSubmitInfo->commandBufferCount != 0 ||
                                 msg.field_2._M_allocated_capacity._0_4_ != 0) ||
                                 (int)((ulong)((long)(this->m_TempSignalSemaphores).
                                                                                                          
                                                  super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->m_TempSignalSemaphores).
                                                                                                        
                                                  super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)
                                 != 0,0),(VkSubmitInfo *)&msg,
                           ((NewSyncPoint.
                             super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_Fence).m_VkSyncObject);
  if (VVar3 != VK_SUCCESS) {
    FormatString<char[53]>
              (&msg_1,(char (*) [53])"Failed to submit command buffer to the command queue");
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"Submit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xbe);
    std::__cxx11::string::~string((string *)&msg_1);
  }
  this_00 = (this->m_pFence).m_pObject;
  if (this_00 == (FenceVkImpl *)0x0) {
    FormatString<char[45]>(&msg_1,(char (*) [45])"Command queue fence has not been initialized");
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"Submit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xc1);
    std::__cxx11::string::~string((string *)&msg_1);
    this_00 = (this->m_pFence).m_pObject;
  }
  CommandQueueId.m_Value = (this->m_CommandQueueId).m_Value;
  std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>);
  FenceVkImpl::AddPendingSyncPoint(this_00,CommandQueueId,Value,(SyncPointVkPtr *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  Threading::SpinLock::lock(&this->m_LastSyncPointLock);
  std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_LastSyncPoint).
              super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>,
             &NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>);
  Threading::SpinLock::unlock(&this->m_LastSyncPointLock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
  return Value;
}

Assistant:

Uint64 CommandQueueVkImpl::Submit(const VkSubmitInfo& InSubmitInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Increment the value before submitting the buffer to be overly safe
    const uint64_t FenceValue = m_NextFenceValue.fetch_add(1);

    auto NewSyncPoint = CreateSyncPoint(FenceValue);

    m_TempSignalSemaphores.clear();
    NewSyncPoint->GetSemaphores(m_TempSignalSemaphores);

#ifdef DILIGENT_DEBUG
    const VkBaseInStructure* pStruct = static_cast<const VkBaseInStructure*>(InSubmitInfo.pNext);
    for (; pStruct != nullptr;)
    {
        if (pStruct->sType == VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO)
        {
            VERIFY(m_TempSignalSemaphores.empty(), "Can not append semaphores when timeline semaphores are used");
            break;
        }
        pStruct = pStruct->pNext;
    }
#endif

    for (uint32_t s = 0; s < InSubmitInfo.signalSemaphoreCount; ++s)
        m_TempSignalSemaphores.push_back(InSubmitInfo.pSignalSemaphores[s]);

    VkSubmitInfo SubmitInfo         = InSubmitInfo;
    SubmitInfo.signalSemaphoreCount = static_cast<Uint32>(m_TempSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = m_TempSignalSemaphores.data();

    const uint32_t SubmitCount =
        (SubmitInfo.waitSemaphoreCount != 0 ||
         SubmitInfo.commandBufferCount != 0 ||
         SubmitInfo.signalSemaphoreCount != 0) ?
        1 :
        0;

    auto err = vkQueueSubmit(m_VkQueue, SubmitCount, &SubmitInfo, NewSyncPoint->GetFence());
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit command buffer to the command queue");
    (void)err;

    VERIFY(m_pFence != nullptr, "Command queue fence has not been initialized");
    m_pFence->AddPendingSyncPoint(m_CommandQueueId, FenceValue, NewSyncPoint);

    // Update the last sync point
    {
        Threading::SpinLockGuard SyncPointGuard{m_LastSyncPointLock};
        m_LastSyncPoint = std::move(NewSyncPoint);
    }

    return FenceValue;
}